

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O0

char * fread_word(FILE *fp)

{
  char cVar1;
  int iVar2;
  FILE *in_RDI;
  char (*unaff_retaddr) [4608];
  CLogger *in_stack_00000008;
  string_view in_stack_00000010;
  char cEnd;
  char *pword;
  uint local_2c;
  char *in_stack_ffffffffffffffd8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffe0;
  char local_11;
  char *local_10;
  
  do {
    iVar2 = getc(in_RDI);
    cVar1 = (char)iVar2;
    iVar2 = isspace((int)cVar1);
  } while (iVar2 != 0);
  if ((cVar1 == '\'') || (cVar1 == '\"')) {
    local_10 = fread_word::word;
    local_11 = cVar1;
  }
  else {
    local_10 = fread_word::word + 1;
    local_11 = ' ';
    fread_word::word[0] = cVar1;
  }
  while( true ) {
    if (fread_word::word + 0x11ff < local_10) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      CLogger::Error<char(&)[4608]>(in_stack_00000008,in_stack_00000010,unaff_retaddr);
      exit(1);
    }
    iVar2 = getc(in_RDI);
    *local_10 = (char)iVar2;
    if (local_11 == ' ') {
      local_2c = isspace((int)*local_10);
    }
    else {
      local_2c = (uint)(*local_10 == local_11);
    }
    if (local_2c != 0) break;
    local_10 = local_10 + 1;
  }
  if (local_11 == ' ') {
    ungetc((int)*local_10,in_RDI);
  }
  *local_10 = '\0';
  return fread_word::word;
}

Assistant:

char *fread_word(FILE *fp)
{
	static char word[MAX_INPUT_LENGTH];
	char *pword;
	char cEnd;

	do
	{
		cEnd = getc(fp);
	} while (isspace(cEnd));

	if (cEnd == '\'' || cEnd == '"')
	{
		pword = word;
	}
	else
	{
		word[0] = cEnd;
		pword = word + 1;
		cEnd = ' ';
	}

	for (; pword < word + MAX_INPUT_LENGTH; pword++)
	{
		*pword = getc(fp);
		if (cEnd == ' ' ? isspace(*pword) : *pword == cEnd)
		{
			if (cEnd == ' ')
				ungetc(*pword, fp);

			*pword = '\0';
			return word;
		}
	}

	RS.Logger.Error("Fread_word: word too long [{}].", word);
	exit(1);
	return nullptr;
}